

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

void __thiscall args::NamedBase::~NamedBase(NamedBase *this)

{
  NamedBase *in_RDI;
  
  ~NamedBase(in_RDI);
  operator_delete(in_RDI);
  return;
}

Assistant:

virtual ~NamedBase() {}